

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::protos::gen::AndroidLogConfig::~AndroidLogConfig(AndroidLogConfig *this)

{
  AndroidLogConfig *this_local;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__AndroidLogConfig_009c1180;
  ::std::__cxx11::string::~string((string *)&this->unknown_fields_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->filter_tags_);
  std::
  vector<perfetto::protos::gen::AndroidLogId,_std::allocator<perfetto::protos::gen::AndroidLogId>_>
  ::~vector(&this->log_ids_);
  protozero::CppMessageObj::~CppMessageObj(&this->super_CppMessageObj);
  return;
}

Assistant:

AndroidLogConfig::~AndroidLogConfig() = default;